

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

void __thiscall
fmt::v11::buffered_file::buffered_file(buffered_file *this,cstring_view filename,cstring_view mode)

{
  FILE *pFVar1;
  int *piVar2;
  v11 *this_00;
  format_string<const_char_*> fmt;
  char *local_28;
  
  do {
    pFVar1 = fopen(filename.data_,mode.data_);
    this->file_ = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (v11 *)__cxa_allocate_exception(0x20);
  fmt.str_.size_ = 0x13;
  fmt.str_.data_ = "cannot open file {}";
  local_28 = filename.data_;
  system_error<char_const*>(this_00,*piVar2,fmt,&local_28);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

buffered_file::buffered_file(cstring_view filename, cstring_view mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())),
                nullptr);
  if (!file_)
    FMT_THROW(system_error(errno, FMT_STRING("cannot open file {}"),
                           filename.c_str()));
}